

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3BeginWriteOperation(Parse *pParse,int setStatement,int iDb)

{
  Parse *pParse_00;
  uint uVar1;
  
  pParse_00 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pParse_00 = pParse;
  }
  uVar1 = 1 << ((byte)iDb & 0x1f);
  if (((pParse_00->cookieMask >> (iDb & 0x1fU) & 1) == 0) &&
     (pParse_00->cookieMask = pParse_00->cookieMask | uVar1, iDb == 1)) {
    sqlite3OpenTempDatabase(pParse_00);
  }
  pParse_00->writeMask = pParse_00->writeMask | uVar1;
  pParse_00->isMultiWrite = pParse_00->isMultiWrite | (byte)setStatement;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginWriteOperation(Parse *pParse, int setStatement, int iDb){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  sqlite3CodeVerifySchemaAtToplevel(pToplevel, iDb);
  DbMaskSet(pToplevel->writeMask, iDb);
  pToplevel->isMultiWrite |= setStatement;
}